

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-data-getter-setters.c
# Opt level: O3

char * uv_handle_type_name(uv_handle_type type)

{
  if (type < (UV_HANDLE_TYPE_MAX|UV_ASYNC)) {
    return *(char **)(&DAT_00126d50 + (ulong)type * 8);
  }
  return (char *)0x0;
}

Assistant:

const char* uv_handle_type_name(uv_handle_type type) {
  switch (type) {
#define XX(uc,lc) case UV_##uc: return #lc;
  UV_HANDLE_TYPE_MAP(XX)
#undef XX
  case UV_FILE: return "file";
  case UV_HANDLE_TYPE_MAX:
  case UV_UNKNOWN_HANDLE: return NULL;
  }
  return NULL;
}